

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

hostent * co_gethostbyname(char *name)

{
  size_t sVar1;
  hostent *__result_buf;
  hostent *__name;
  int iVar2;
  hostbuf_wrap *phVar3;
  char *pcVar4;
  hostbuf_wrap *phVar5;
  bool bVar6;
  int ret;
  int *h_errnop;
  hostent *result;
  hostent *host;
  char *name_local;
  
  if (name == (char *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    host = (hostent *)name;
    phVar3 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                       ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
    if (phVar3->buffer != (char *)0x0) {
      phVar3 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      if (0x400 < phVar3->iBufferSize) {
        phVar3 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                           ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap)
        ;
        free(phVar3->buffer);
        phVar3 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                           ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap)
        ;
        phVar3->buffer = (char *)0x0;
      }
    }
    phVar3 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                       ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
    if (phVar3->buffer == (char *)0x0) {
      pcVar4 = (char *)malloc(0x400);
      phVar3 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      phVar3->buffer = pcVar4;
      phVar3 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      phVar3->iBufferSize = 0x400;
    }
    result = &clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                        ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap)->
              host;
    h_errnop = (int *)0x0;
    phVar3 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                       ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
    while( true ) {
      __name = host;
      __result_buf = result;
      phVar5 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      pcVar4 = phVar5->buffer;
      phVar5 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      iVar2 = gethostbyname_r((char *)__name,(hostent *)__result_buf,pcVar4,phVar5->iBufferSize,
                              (hostent **)&h_errnop,&phVar3->host_errno);
      bVar6 = false;
      if (iVar2 == 0x22) {
        bVar6 = phVar3->host_errno == -1;
      }
      if (!bVar6) break;
      phVar5 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      free(phVar5->buffer);
      phVar5 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      sVar1 = phVar5->iBufferSize;
      phVar5 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      phVar5->iBufferSize = sVar1 << 1;
      phVar5 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      pcVar4 = (char *)malloc(phVar5->iBufferSize);
      phVar5 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      phVar5->buffer = pcVar4;
    }
    if ((bVar6) || (result != (hostent *)h_errnop)) {
      name_local = (char *)0x0;
    }
    else {
      name_local = (char *)result;
    }
  }
  return (hostent *)name_local;
}

Assistant:

struct hostent *co_gethostbyname(const char *name)
{
	if (!name)
	{
		return NULL;
	}

	if (__co_hostbuf_wrap->buffer && __co_hostbuf_wrap->iBufferSize > 1024)
	{
		free(__co_hostbuf_wrap->buffer);
		__co_hostbuf_wrap->buffer = NULL;
	}
	if (!__co_hostbuf_wrap->buffer)
	{
		__co_hostbuf_wrap->buffer = (char*)malloc(1024);
		__co_hostbuf_wrap->iBufferSize = 1024;
	}

	struct hostent *host = &__co_hostbuf_wrap->host;
	struct hostent *result = NULL;
	int *h_errnop = &(__co_hostbuf_wrap->host_errno);

	int ret = -1;
	while (ret = gethostbyname_r(name, host, __co_hostbuf_wrap->buffer, 
				__co_hostbuf_wrap->iBufferSize, &result, h_errnop) == ERANGE && 
				*h_errnop == NETDB_INTERNAL )
	{
		free(__co_hostbuf_wrap->buffer);
		__co_hostbuf_wrap->iBufferSize = __co_hostbuf_wrap->iBufferSize * 2;
		__co_hostbuf_wrap->buffer = (char*)malloc(__co_hostbuf_wrap->iBufferSize);
	}

	if (ret == 0 && (host == result)) 
	{
		return host;
	}
	return NULL;
}